

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_dual.cpp
# Opt level: O3

void __thiscall
cppcms::sessions::session_dual::session_dual
          (session_dual *this,
          unique_ptr<cppcms::sessions::encryptor,_std::default_delete<cppcms::sessions::encryptor>_>
          *enc,shared_ptr<cppcms::sessions::session_storage> *storage,size_t limit)

{
  session_cookies *this_00;
  session_sid *this_01;
  _Head_base<0UL,_cppcms::sessions::encryptor_*,_false> local_50;
  shared_ptr<cppcms::sessions::session_storage> local_48;
  
  (this->super_session_api)._vptr_session_api = (_func_int **)&PTR_save_00289780;
  (this->d).ptr_ = (_data *)0x0;
  this_00 = (session_cookies *)operator_new(0x18);
  local_50._M_head_impl =
       (enc->_M_t).
       super___uniq_ptr_impl<cppcms::sessions::encryptor,_std::default_delete<cppcms::sessions::encryptor>_>
       ._M_t.
       super__Tuple_impl<0UL,_cppcms::sessions::encryptor_*,_std::default_delete<cppcms::sessions::encryptor>_>
       .super__Head_base<0UL,_cppcms::sessions::encryptor_*,_false>._M_head_impl;
  (enc->_M_t).
  super___uniq_ptr_impl<cppcms::sessions::encryptor,_std::default_delete<cppcms::sessions::encryptor>_>
  ._M_t.
  super__Tuple_impl<0UL,_cppcms::sessions::encryptor_*,_std::default_delete<cppcms::sessions::encryptor>_>
  .super__Head_base<0UL,_cppcms::sessions::encryptor_*,_false>._M_head_impl = (encryptor *)0x0;
  session_cookies::session_cookies
            (this_00,(unique_ptr<cppcms::sessions::encryptor,_std::default_delete<cppcms::sessions::encryptor>_>
                      *)&local_50);
  (this->client_).super___shared_ptr<cppcms::sessions::session_cookies,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = this_00;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<cppcms::sessions::session_cookies*>
            (&(this->client_).
              super___shared_ptr<cppcms::sessions::session_cookies,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,this_00);
  if (local_50._M_head_impl != (encryptor *)0x0) {
    (*(local_50._M_head_impl)->_vptr_encryptor[3])();
  }
  local_50._M_head_impl = (encryptor *)0x0;
  this_01 = (session_sid *)operator_new(0x20);
  local_48.super___shared_ptr<cppcms::sessions::session_storage,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (storage->super___shared_ptr<cppcms::sessions::session_storage,_(__gnu_cxx::_Lock_policy)2>
         )._M_ptr;
  local_48.super___shared_ptr<cppcms::sessions::session_storage,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       (storage->super___shared_ptr<cppcms::sessions::session_storage,_(__gnu_cxx::_Lock_policy)2>).
       _M_refcount._M_pi;
  (storage->super___shared_ptr<cppcms::sessions::session_storage,_(__gnu_cxx::_Lock_policy)2>).
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (storage->super___shared_ptr<cppcms::sessions::session_storage,_(__gnu_cxx::_Lock_policy)2>).
  _M_ptr = (element_type *)0x0;
  session_sid::session_sid(this_01,&local_48);
  (this->server_).super___shared_ptr<cppcms::sessions::session_sid,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = this_01;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<cppcms::sessions::session_sid*>
            (&(this->server_).
              super___shared_ptr<cppcms::sessions::session_sid,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,this_01);
  if (local_48.super___shared_ptr<cppcms::sessions::session_storage,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.
               super___shared_ptr<cppcms::sessions::session_storage,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  this->data_size_limit_ = limit;
  return;
}

Assistant:

session_dual::session_dual(std::unique_ptr<encryptor> enc,booster::shared_ptr<session_storage> storage,size_t limit) :
	client_(new session_cookies(std::move(enc))),
	server_(new session_sid(std::move(storage))),
	data_size_limit_(limit)
{
}